

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

StatWriter * __thiscall OpenMD::Integrator::createStatWriter(Integrator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Stats *this_00;
  StatWriter *pSVar3;
  string local_40;
  
  this_00 = (Stats *)operator_new(0x68);
  Stats::Stats(this_00,this->info_);
  this->stats = this_00;
  pSVar3 = (StatWriter *)operator_new(0x448);
  paVar1 = &local_40.field_2;
  pcVar2 = (this->info_->statFileName_)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (this->info_->statFileName_)._M_string_length);
  StatWriter::StatWriter(pSVar3,&local_40,this->stats);
  this->statWriter = pSVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pSVar3 = this->statWriter;
  pcVar2 = (this->info_->reportFileName_)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (this->info_->reportFileName_)._M_string_length);
  std::__cxx11::string::_M_assign((string *)&pSVar3->reportFileName_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this->statWriter;
}

Assistant:

StatWriter* Integrator::createStatWriter() {
    stats      = new Stats(info_);
    statWriter = new StatWriter(info_->getStatFileName(), stats);
    statWriter->setReportFileName(info_->getReportFileName());

    return statWriter;
  }